

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

void idx2::Dealloc(brick_pool *Bp)

{
  allocator *paVar1;
  hash_table<unsigned_long,_idx2::brick_volume> *Ht;
  hash_table<unsigned_long,_idx2::brick_volume> *extraout_RDX;
  hash_table<unsigned_long,_idx2::brick_volume> *Ht_00;
  iterator local_70;
  undefined1 local_50 [8];
  iterator It;
  brick_pool *Bp_local;
  
  paVar1 = (Bp->ResolutionLevels).Alloc;
  It.Idx = (i64)Bp;
  (*paVar1->_vptr_allocator[1])(paVar1,&Bp->ResolutionLevels);
  (Bp->ResolutionLevels).Capacity = 0;
  (Bp->ResolutionLevels).Size = 0;
  Begin<unsigned_long,idx2::brick_volume>((iterator *)local_50,(idx2 *)It.Idx,Ht);
  Ht_00 = extraout_RDX;
  while (End<unsigned_long,idx2::brick_volume>(&local_70,(idx2 *)It.Idx,Ht_00),
        It.Val != (brick_volume *)local_70.Ht ||
        It.Ht != (hash_table<unsigned_long,_idx2::brick_volume> *)local_70.Idx) {
    Dealloc((volume *)It.Key);
    do {
      It.Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)((long)&(It.Ht)->Keys + 1);
    } while (*(char *)((long)&(It.Ht)->Keys + (long)&(((It.Val)->Vol).Buffer.Alloc)->_vptr_allocator
                      ) != '\x02');
    local_50 = (undefined1  [8])(((It.Val)->Vol).Buffer.Data + (long)It.Ht * 8);
    Ht_00 = (hash_table<unsigned_long,_idx2::brick_volume> *)((long)It.Ht * 0x40);
    It.Key = (unsigned_long *)((long)&Ht_00->Keys + ((It.Val)->Vol).Buffer.Bytes);
  }
  Dealloc<unsigned_long,idx2::brick_volume>((hash_table<unsigned_long,_idx2::brick_volume> *)It.Idx)
  ;
  return;
}

Assistant:

void
Dealloc(brick_pool* Bp)
{
  Dealloc(&Bp->ResolutionLevels);
  idx2_ForEach (It, Bp->BrickTable)
    Dealloc(&It.Val->Vol);
  Dealloc(&Bp->BrickTable);
}